

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::
FormatString<char[10],char_const*,char[4],char[54],unsigned_int,char[39],unsigned_int,char[34],unsigned_int,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [10],char **Args_1,
          char (*Args_2) [4],char (*Args_3) [54],uint *Args_4,char (*Args_5) [39],uint *Args_6,
          char (*Args_7) [34],uint *Args_8,char (*Args_9) [3])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[10],char_const*,char[4],char[54],unsigned_int,char[39],unsigned_int,char[34],unsigned_int,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [10])this,(char **)Args,(char (*) [4])Args_1,(char (*) [54])Args_2,
             (uint *)Args_3,(char (*) [39])Args_4,(uint *)Args_5,(char (*) [34])Args_6,
             (uint *)Args_7,(char (*) [3])Args_8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}